

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O3

void object_suite::test_string_collector(void)

{
  bool bVar1;
  value vVar2;
  string result;
  reader reader;
  char input [21];
  uint local_198;
  value local_194;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_reader<char> local_170;
  char local_28 [24];
  
  builtin_strncpy(local_28,"{\"alpha\":\"hydrogen\"}",0x15);
  local_190._M_dataplus._M_p = (pointer)strlen(local_28);
  local_190._M_string_length = (size_type)local_28;
  trial::protocol::json::basic_reader<char>::basic_reader(&local_170,(view_type *)&local_190);
  local_190._M_string_length = 0;
  local_190.field_2._M_local_buf[0] = '\0';
  local_194 = local_170.decoder.current.code;
  local_198 = 0xe;
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::begin_object",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x313,"void object_suite::test_string_collector()",&local_194,&local_198);
  bVar1 = trial::protocol::json::basic_reader<char>::next(&local_170);
  local_194 = CONCAT31(local_194._1_3_,bVar1);
  local_198 = CONCAT31(local_198._1_3_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x314,"void object_suite::test_string_collector()",&local_194,&local_198);
  local_194 = local_170.decoder.current.code;
  local_198 = 0xb;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::key",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x315,"void object_suite::test_string_collector()",&local_194,&local_198);
  vVar2 = error_name_separator;
  if ((local_170.decoder.current.code & error_invalid_key) == string) {
    trial::protocol::json::detail::basic_decoder<char>::string_value<std::__cxx11::string>
              (&local_170.decoder,&local_190);
    vVar2 = end;
  }
  local_198 = 0;
  local_194 = vVar2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::errc,trial::protocol::json::errc>
            ("reader.string(result)","json::errc::no_error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x316,"void object_suite::test_string_collector()",&local_194,&local_198);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[6]>
            ("result","\"alpha\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x317,"void object_suite::test_string_collector()",&local_190,"alpha");
  local_190._M_string_length = 0;
  *local_190._M_dataplus._M_p = '\0';
  bVar1 = trial::protocol::json::basic_reader<char>::next(&local_170);
  local_194 = CONCAT31(local_194._1_3_,bVar1);
  local_198 = CONCAT31(local_198._1_3_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x319,"void object_suite::test_string_collector()",&local_194,&local_198);
  local_194 = local_170.decoder.current.code;
  local_198 = 10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x31a,"void object_suite::test_string_collector()",&local_194,&local_198);
  vVar2 = error_name_separator;
  if ((local_170.decoder.current.code & error_invalid_key) == string) {
    trial::protocol::json::detail::basic_decoder<char>::string_value<std::__cxx11::string>
              (&local_170.decoder,&local_190);
    vVar2 = end;
  }
  local_198 = 0;
  local_194 = vVar2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::errc,trial::protocol::json::errc>
            ("reader.string(result)","json::errc::no_error",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x31b,"void object_suite::test_string_collector()",&local_194,&local_198);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[9]>
            ("result","\"hydrogen\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x31c,"void object_suite::test_string_collector()",&local_190,"hydrogen");
  bVar1 = trial::protocol::json::basic_reader<char>::next(&local_170);
  local_194 = CONCAT31(local_194._1_3_,bVar1);
  local_198 = CONCAT31(local_198._1_3_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x31d,"void object_suite::test_string_collector()",&local_194,&local_198);
  local_194 = local_170.decoder.current.code;
  local_198 = 0xf;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end_object",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x31e,"void object_suite::test_string_collector()",&local_194,&local_198);
  bVar1 = trial::protocol::json::basic_reader<char>::next(&local_170);
  local_194 = CONCAT31(local_194._1_3_,bVar1);
  local_198 = local_198 & 0xffffff00;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,799,"void object_suite::test_string_collector()",&local_194,&local_198);
  local_194 = local_170.decoder.current.code;
  local_198 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,800,"void object_suite::test_string_collector()",&local_194,&local_198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,
                    CONCAT71(local_190.field_2._M_allocated_capacity._1_7_,
                             local_190.field_2._M_local_buf[0]) + 1);
  }
  if (local_170.stack.c.
      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_170.stack.c.
                    super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_170.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_170.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void test_string_collector()
{
    const char input[] = "{\"alpha\":\"hydrogen\"}";
    json::reader reader(input);
    std::string result;
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::begin_object);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::key);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.string(result), json::errc::no_error);
    TRIAL_PROTOCOL_TEST_EQUAL(result, "alpha");
    result.clear();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::string);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.string(result), json::errc::no_error);
    TRIAL_PROTOCOL_TEST_EQUAL(result, "hydrogen");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), true);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end_object);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), false);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::end);
}